

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nName,int nArg,u8 enc,u8 createFlag)

{
  int iVar1;
  int iVar2;
  int score_1;
  FuncDefHash *pHash;
  int score;
  int h;
  int bestScore;
  FuncDef *pBest;
  FuncDef *p;
  u8 createFlag_local;
  u8 enc_local;
  int nArg_local;
  int nName_local;
  char *zName_local;
  sqlite3 *db_local;
  
  _h = (sqlite3 *)0x0;
  score = 0;
  iVar2 = (int)((uint)""[(byte)*zName] + nName) % 0x17;
  for (pBest = functionSearch(&db->aFunc,iVar2,zName,nName); pBest != (FuncDef *)0x0;
      pBest = pBest->pNext) {
    iVar1 = matchQuality(pBest,nArg,enc);
    if (score < iVar1) {
      _h = (sqlite3 *)pBest;
      score = iVar1;
    }
  }
  if ((createFlag == '\0') && ((_h == (sqlite3 *)0x0 || ((db->flags & 0x100000U) != 0)))) {
    score = 0;
    for (pBest = functionSearch(&sqlite3GlobalFunctions,iVar2,zName,nName); pBest != (FuncDef *)0x0;
        pBest = pBest->pNext) {
      iVar2 = matchQuality(pBest,nArg,enc);
      if (score < iVar2) {
        _h = (sqlite3 *)pBest;
        score = iVar2;
      }
    }
  }
  if (((createFlag != '\0') && (score < 6)) &&
     (_h = (sqlite3 *)sqlite3DbMallocZero(db,nName + 0x49), _h != (sqlite3 *)0x0)) {
    _h->lastRowid = (i64)&_h->errMask;
    *(i16 *)&_h->pVfs = (i16)nArg;
    *(u8 *)((long)&_h->pVfs + 2) = enc;
    memcpy((char *)_h->lastRowid,zName,(long)nName);
    ((char *)_h->lastRowid)[nName] = '\0';
    sqlite3FuncDefInsert(&db->aFunc,(FuncDef *)_h);
  }
  if ((_h == (sqlite3 *)0x0) ||
     (((_h->aDb == (Db *)0x0 && (_h->mutex == (sqlite3_mutex *)0x0)) && (createFlag == '\0')))) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = _h;
  }
  return (FuncDef *)db_local;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  Not null-terminated */
  int nName,         /* Number of characters in the name */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  h = (sqlite3UpperToLower[(u8)zName[0]] + nName) % ArraySize(db->aFunc.a);

  /* First search for a match amongst the application-defined functions.
  */
  p = functionSearch(&db->aFunc, h, zName, nName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the SQLITE_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */ 
  if( !createFlag && (pBest==0 || (db->flags & SQLITE_PreferBuiltin)!=0) ){
    FuncDefHash *pHash = &GLOBAL(FuncDefHash, sqlite3GlobalFunctions);
    bestScore = 0;
    p = functionSearch(pHash, h, zName, nName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH && 
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    pBest->zName = (char *)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->iPrefEnc = enc;
    memcpy(pBest->zName, zName, nName);
    pBest->zName[nName] = 0;
    sqlite3FuncDefInsert(&db->aFunc, pBest);
  }

  if( pBest && (pBest->xStep || pBest->xFunc || createFlag) ){
    return pBest;
  }
  return 0;
}